

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::JoinStrings
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *components,char *delim,string *result)

{
  ulong *puVar1;
  LogMessage *other;
  ulong *puVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  ulong *puVar3;
  long lVar4;
  LogMessage local_78;
  char *local_40;
  LogFinisher local_31;
  
  puVar3 = *(ulong **)components;
  puVar1 = *(ulong **)(components + 8);
  local_40 = delim;
  if (result == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/strutil.cc"
               ,0x10d);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: result != nullptr: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  result->_M_string_length = 0;
  *(result->_M_dataplus)._M_p = '\0';
  strlen(local_40);
  puVar2 = puVar3;
  if (puVar1 == puVar3) {
    std::__cxx11::string::reserve((ulong)result);
  }
  else {
    do {
      puVar2 = puVar2 + 4;
    } while (puVar2 != puVar1);
    std::__cxx11::string::reserve((ulong)result);
    lVar4 = 0;
    do {
      if (lVar4 != 0) {
        std::__cxx11::string::append((char *)result,(ulong)local_40);
      }
      std::__cxx11::string::append((char *)result,*puVar3);
      puVar3 = puVar3 + 4;
      lVar4 = lVar4 + -0x20;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

void JoinStrings(const std::vector<string>& components,
                 const char* delim,
                 string * result) {
  JoinStringsIterator(components.begin(), components.end(), delim, result);
}